

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::LSTM_x86_fma::create_pipeline(LSTM_x86_fma *this,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  int *piVar14;
  Allocator *pAVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  void *pvVar24;
  ulong uVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  ulong uVar33;
  void *pvVar34;
  void *pvVar35;
  void *pvVar36;
  uint _w;
  void *pvVar38;
  void *pvVar39;
  long lVar40;
  long lVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  void *pvVar45;
  long lVar46;
  void *pvVar47;
  void *pvVar48;
  void *pvVar49;
  long lVar50;
  void *pvVar51;
  long lVar52;
  void *pvVar53;
  void *pvVar54;
  long lVar55;
  void *pvVar56;
  ulong uVar57;
  undefined4 *puVar58;
  ulong uVar59;
  void *pvVar60;
  ulong uVar61;
  uint _c;
  long lVar62;
  void *pvVar63;
  void *pvVar64;
  ulong uVar65;
  void *local_240;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  long local_1d0;
  long local_1c8;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  int iVar37;
  
  if ((this->super_LSTM).int8_scale_term == 0) {
    _c = ((this->super_LSTM).direction == 2) + 1;
    uVar59 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
    iVar1 = (this->super_LSTM).hidden_size;
    iVar16 = (int)((long)((ulong)(uint)((int)uVar59 >> 0x1f) << 0x20 | uVar59 & 0xffffffff) /
                  (long)iVar1);
    iVar37 = iVar16 + 3;
    if (-1 < iVar16) {
      iVar37 = iVar16;
    }
    _w = iVar37 >> 2;
    uVar61 = 0;
    Mat::create(&this->weight_xc_data_packed,_w,iVar1 / 2 + iVar1 % 2,_c,0x20,8,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,(this->super_LSTM).hidden_size,1,_c,0x10,4,
                (Allocator *)0x0);
    iVar1 = (this->super_LSTM).hidden_size;
    Mat::create(&this->weight_hc_data_packed,(this->super_LSTM).num_output,iVar1 / 2 + iVar1 % 2,_c,
                0x20,8,(Allocator *)0x0);
    sVar4 = (this->super_LSTM).weight_xc_data.elemsize;
    lVar22 = (this->super_LSTM).weight_xc_data.cstep * sVar4;
    sVar5 = (this->super_LSTM).bias_c_data.elemsize;
    sVar6 = (this->super_LSTM).bias_c_data.cstep;
    sVar7 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar23 = (this->super_LSTM).weight_hc_data.cstep * sVar7;
    sVar8 = (this->weight_xc_data_packed).elemsize;
    sVar9 = (this->bias_c_data_packed).cstep;
    sVar10 = (this->bias_c_data_packed).elemsize;
    sVar11 = (this->weight_hc_data_packed).elemsize;
    lVar44 = (long)(this->super_LSTM).bias_c_data.w * sVar5;
    uVar2 = (this->super_LSTM).hidden_size;
    uVar57 = (ulong)uVar2;
    uVar25 = (ulong)(uVar2 * 3);
    lVar55 = (long)(this->super_LSTM).weight_xc_data.w * sVar4;
    lVar41 = (this->weight_xc_data_packed).cstep * sVar8;
    lVar52 = (long)(this->weight_xc_data_packed).w * sVar8;
    lVar50 = (long)(this->super_LSTM).weight_hc_data.w * sVar7;
    lVar29 = (this->weight_hc_data_packed).cstep * sVar11;
    lVar62 = (long)(this->weight_hc_data_packed).w * sVar11;
    pvVar34 = (this->super_LSTM).weight_xc_data.data;
    pvVar38 = (void *)(lVar55 * (uVar25 + 1) + (long)pvVar34);
    uVar59 = (ulong)(uVar2 * 2);
    local_1f8 = (void *)(lVar55 * (uVar59 + 1) + (long)pvVar34);
    local_200 = (void *)(lVar55 * (uVar57 + 1) + (long)pvVar34);
    pvVar63 = (void *)(lVar55 * uVar25 + (long)pvVar34);
    local_1e8 = (void *)(lVar55 * uVar59 + (long)pvVar34);
    local_208 = (void *)(lVar55 * uVar57 + (long)pvVar34);
    pvVar54 = (this->super_LSTM).weight_hc_data.data;
    pvVar26 = (void *)((uVar25 + 1) * lVar50 + (long)pvVar54);
    local_1f0 = (void *)((uVar59 + 1) * lVar50 + (long)pvVar54);
    pvVar47 = (void *)((uVar57 + 1) * lVar50 + (long)pvVar54);
    pvVar30 = (void *)(lVar50 * uVar25 + (long)pvVar54);
    pvVar35 = (void *)(lVar50 * uVar59 + (long)pvVar54);
    pvVar24 = (void *)(lVar50 * uVar57 + (long)pvVar54);
    uVar3 = (this->super_LSTM).num_output;
    pvVar12 = (this->super_LSTM).bias_c_data.data;
    local_240 = (this->weight_xc_data_packed).data;
    pvVar13 = (this->bias_c_data_packed).data;
    pvVar49 = (this->weight_hc_data_packed).data;
    lVar17 = lVar55 * 2;
    local_210 = (void *)((long)pvVar34 + lVar55);
    lVar18 = lVar50 * 2;
    pvVar43 = (void *)((long)pvVar54 + lVar50);
    local_1d0 = (long)local_240 + 8;
    local_1c8 = (long)pvVar49 + 8;
    do {
      lVar27 = sVar6 * sVar5 * uVar61;
      puVar58 = (undefined4 *)(sVar9 * sVar10 * uVar61 + (long)pvVar13);
      lVar19 = lVar44 + lVar27;
      lVar20 = lVar44 * 2 + lVar27;
      lVar21 = lVar44 * 3 + lVar27;
      if ((int)uVar2 < 2) {
        uVar59 = 0;
      }
      else {
        local_158 = local_208;
        local_160 = local_210;
        local_168 = local_200;
        local_170 = local_1f8;
        uVar25 = 0;
        pvVar31 = local_240;
        pvVar32 = local_1e8;
        pvVar36 = pvVar35;
        pvVar39 = pvVar47;
        pvVar42 = pvVar43;
        pvVar45 = pvVar38;
        pvVar48 = pvVar49;
        pvVar51 = pvVar26;
        pvVar53 = pvVar54;
        pvVar56 = pvVar24;
        pvVar60 = local_1f0;
        pvVar64 = pvVar63;
        local_178 = pvVar30;
        local_150 = pvVar34;
        do {
          *puVar58 = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar27);
          puVar58[1] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar19);
          puVar58[2] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar20);
          puVar58[3] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar21);
          puVar58[4] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar27 + 4);
          puVar58[5] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar19 + 4);
          puVar58[6] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar20 + 4);
          puVar58[7] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar21 + 4);
          if (3 < iVar16) {
            lVar28 = 0;
            uVar59 = (ulong)_w;
            do {
              *(undefined4 *)((long)pvVar31 + lVar28 * 8) =
                   *(undefined4 *)((long)local_150 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 4) =
                   *(undefined4 *)((long)local_158 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 8) =
                   *(undefined4 *)((long)pvVar32 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 0xc) =
                   *(undefined4 *)((long)pvVar64 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 0x10) =
                   *(undefined4 *)((long)local_160 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 0x14) =
                   *(undefined4 *)((long)local_168 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 0x18) =
                   *(undefined4 *)((long)local_170 + lVar28);
              *(undefined4 *)((long)pvVar31 + lVar28 * 8 + 0x1c) =
                   *(undefined4 *)((long)pvVar45 + lVar28);
              lVar28 = lVar28 + 4;
              uVar59 = uVar59 - 1;
            } while (uVar59 != 0);
          }
          if (0 < (int)uVar3) {
            lVar28 = 0;
            do {
              *(undefined4 *)((long)pvVar48 + lVar28 * 8) = *(undefined4 *)((long)pvVar53 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 4) =
                   *(undefined4 *)((long)pvVar56 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 8) =
                   *(undefined4 *)((long)pvVar36 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 0xc) =
                   *(undefined4 *)((long)local_178 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 0x10) =
                   *(undefined4 *)((long)pvVar42 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 0x14) =
                   *(undefined4 *)((long)pvVar39 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 0x18) =
                   *(undefined4 *)((long)pvVar60 + lVar28);
              *(undefined4 *)((long)pvVar48 + lVar28 * 8 + 0x1c) =
                   *(undefined4 *)((long)pvVar51 + lVar28);
              lVar28 = lVar28 + 4;
            } while ((ulong)uVar3 << 2 != lVar28);
          }
          puVar58 = puVar58 + 8;
          uVar59 = uVar25 + 2;
          lVar28 = uVar25 + 3;
          pvVar45 = (void *)((long)pvVar45 + lVar17);
          local_170 = (void *)((long)local_170 + lVar17);
          local_168 = (void *)((long)local_168 + lVar17);
          local_160 = (void *)((long)local_160 + lVar17);
          pvVar64 = (void *)((long)pvVar64 + lVar17);
          pvVar32 = (void *)((long)pvVar32 + lVar17);
          local_158 = (void *)((long)local_158 + lVar17);
          local_150 = (void *)((long)local_150 + lVar17);
          pvVar31 = (void *)((long)pvVar31 + lVar52);
          pvVar51 = (void *)((long)pvVar51 + lVar18);
          pvVar60 = (void *)((long)pvVar60 + lVar18);
          pvVar39 = (void *)((long)pvVar39 + lVar18);
          pvVar42 = (void *)((long)pvVar42 + lVar18);
          local_178 = (void *)((long)local_178 + lVar18);
          pvVar36 = (void *)((long)pvVar36 + lVar18);
          pvVar56 = (void *)((long)pvVar56 + lVar18);
          pvVar53 = (void *)((long)pvVar53 + lVar18);
          pvVar48 = (void *)((long)pvVar48 + lVar62);
          uVar25 = uVar59;
        } while (lVar28 < (int)uVar2);
      }
      if ((int)uVar59 < (int)uVar2) {
        uVar25 = uVar59 & 0xffffffff;
        lVar28 = (long)(int)(uVar2 * 3) + uVar25;
        pvVar32 = (void *)(lVar55 * lVar28 + (long)pvVar34);
        lVar40 = (long)(int)(uVar2 * 2) + uVar25;
        pvVar39 = (void *)(lVar55 * lVar40 + (long)pvVar34);
        lVar46 = (long)(int)uVar2 + uVar25;
        pvVar45 = (void *)(lVar55 * lVar46 + (long)pvVar34);
        pvVar48 = (void *)(lVar55 * uVar25 + (long)pvVar34);
        pvVar31 = (void *)(lVar28 * lVar50 + (long)pvVar54);
        pvVar36 = (void *)(lVar40 * lVar50 + (long)pvVar54);
        pvVar42 = (void *)(lVar46 * lVar50 + (long)pvVar54);
        pvVar51 = (void *)(lVar50 * uVar25 + (long)pvVar54);
        do {
          uVar33 = (ulong)(((uint)uVar59 & 1) + ((uint)(uVar59 >> 1) & 0x7fffffff));
          *puVar58 = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar27);
          puVar58[1] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar19);
          puVar58[2] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar20);
          puVar58[3] = *(undefined4 *)((long)pvVar12 + uVar25 * 4 + lVar21);
          if (3 < iVar16) {
            lVar40 = lVar52 * uVar33 + local_1d0;
            lVar28 = 0;
            uVar65 = (ulong)_w;
            do {
              *(undefined4 *)(lVar40 + -8 + lVar28 * 4) = *(undefined4 *)((long)pvVar48 + lVar28);
              *(undefined4 *)(lVar40 + -4 + lVar28 * 4) = *(undefined4 *)((long)pvVar45 + lVar28);
              *(undefined4 *)(lVar40 + lVar28 * 4) = *(undefined4 *)((long)pvVar39 + lVar28);
              *(undefined4 *)(lVar40 + 4 + lVar28 * 4) = *(undefined4 *)((long)pvVar32 + lVar28);
              lVar28 = lVar28 + 4;
              uVar65 = uVar65 - 1;
            } while (uVar65 != 0);
          }
          if (0 < (int)uVar3) {
            lVar28 = uVar33 * lVar62 + local_1c8;
            lVar40 = 0;
            do {
              *(undefined4 *)(lVar28 + -8 + lVar40 * 4) = *(undefined4 *)((long)pvVar51 + lVar40);
              *(undefined4 *)(lVar28 + -4 + lVar40 * 4) = *(undefined4 *)((long)pvVar42 + lVar40);
              *(undefined4 *)(lVar28 + lVar40 * 4) = *(undefined4 *)((long)pvVar36 + lVar40);
              *(undefined4 *)(lVar28 + 4 + lVar40 * 4) = *(undefined4 *)((long)pvVar31 + lVar40);
              lVar40 = lVar40 + 4;
            } while ((ulong)uVar3 << 2 != lVar40);
          }
          puVar58 = puVar58 + 4;
          uVar25 = uVar25 + 1;
          pvVar32 = (void *)((long)pvVar32 + lVar55);
          pvVar39 = (void *)((long)pvVar39 + lVar55);
          pvVar45 = (void *)((long)pvVar45 + lVar55);
          pvVar48 = (void *)((long)pvVar48 + lVar55);
          uVar59 = (ulong)((uint)uVar59 + 1);
          pvVar31 = (void *)((long)pvVar31 + lVar50);
          pvVar36 = (void *)((long)pvVar36 + lVar50);
          pvVar42 = (void *)((long)pvVar42 + lVar50);
          pvVar51 = (void *)((long)pvVar51 + lVar50);
        } while (uVar25 != uVar57);
      }
      uVar61 = uVar61 + 1;
      pvVar38 = (void *)((long)pvVar38 + lVar22);
      local_1f8 = (void *)((long)local_1f8 + lVar22);
      local_200 = (void *)((long)local_200 + lVar22);
      local_210 = (void *)((long)local_210 + lVar22);
      pvVar63 = (void *)((long)pvVar63 + lVar22);
      local_1e8 = (void *)((long)local_1e8 + lVar22);
      local_208 = (void *)((long)local_208 + lVar22);
      pvVar34 = (void *)((long)pvVar34 + lVar22);
      local_240 = (void *)((long)local_240 + lVar41);
      pvVar26 = (void *)((long)pvVar26 + lVar23);
      local_1f0 = (void *)((long)local_1f0 + lVar23);
      pvVar47 = (void *)((long)pvVar47 + lVar23);
      pvVar43 = (void *)((long)pvVar43 + lVar23);
      pvVar30 = (void *)((long)pvVar30 + lVar23);
      pvVar35 = (void *)((long)pvVar35 + lVar23);
      pvVar24 = (void *)((long)pvVar24 + lVar23);
      pvVar54 = (void *)((long)pvVar54 + lVar23);
      pvVar49 = (void *)((long)pvVar49 + lVar29);
      local_1d0 = local_1d0 + lVar41;
      local_1c8 = local_1c8 + lVar29;
    } while (uVar61 != _c);
    if (opt->lightmode != false) {
      piVar14 = (this->super_LSTM).weight_xc_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar43 = (this->super_LSTM).weight_xc_data.data;
          pAVar15 = (this->super_LSTM).weight_xc_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_xc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_xc_data.data = (void *)0x0;
      (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_xc_data.dims = 0;
      (this->super_LSTM).weight_xc_data.w = 0;
      (this->super_LSTM).weight_xc_data.h = 0;
      (this->super_LSTM).weight_xc_data.d = 0;
      (this->super_LSTM).weight_xc_data.c = 0;
      piVar14 = (this->super_LSTM).bias_c_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar43 = (this->super_LSTM).bias_c_data.data;
          pAVar15 = (this->super_LSTM).bias_c_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).bias_c_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
      (this->super_LSTM).bias_c_data.data = (void *)0x0;
      (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
      (this->super_LSTM).bias_c_data.dims = 0;
      (this->super_LSTM).bias_c_data.w = 0;
      (this->super_LSTM).bias_c_data.h = 0;
      (this->super_LSTM).bias_c_data.d = 0;
      (this->super_LSTM).bias_c_data.c = 0;
      piVar14 = (this->super_LSTM).weight_hc_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar43 = (this->super_LSTM).weight_hc_data.data;
          pAVar15 = (this->super_LSTM).weight_hc_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_hc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_hc_data.data = (void *)0x0;
      (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_hc_data.dims = 0;
      (this->super_LSTM).weight_hc_data.w = 0;
      (this->super_LSTM).weight_hc_data.h = 0;
      (this->super_LSTM).weight_hc_data.d = 0;
      (this->super_LSTM).weight_hc_data.c = 0;
    }
  }
  else {
    create_pipeline_int8(this,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86_fma::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}